

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpFinish(void)

{
  Upnp_Handle_Type UVar1;
  int iVar2;
  UpnpDevice_Handle device_handle;
  UpnpClient_Handle client_handle;
  Handle_Info *temp;
  
  if (UpnpSdkInit == 1) {
    UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2b0,
               "Inside UpnpFinish: UpnpSdkInit is %d\n",1);
    if (UpnpSdkInit == 1) {
      UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2b7,"UpnpFinish: UpnpSdkInit is ONE\n");
    }
    PrintThreadPoolStats(&gSendThreadPool,".upnp/src/api/upnpapi.c",0x2ba,"Send Thread Pool");
    PrintThreadPoolStats(&gRecvThreadPool,".upnp/src/api/upnpapi.c",700,"Recv Thread Pool");
    PrintThreadPoolStats
              (&gMiniServerThreadPool,".upnp/src/api/upnpapi.c",0x2bf,"MiniServer Thread Pool");
    while( true ) {
      UVar1 = GetDeviceHandleInfo(0,2,&device_handle,&temp);
      if (UVar1 != HND_DEVICE) break;
      UpnpUnRegisterRootDevice(device_handle);
    }
    while( true ) {
      UVar1 = GetDeviceHandleInfo(0,10,&device_handle,&temp);
      if (UVar1 != HND_DEVICE) break;
      UpnpUnRegisterRootDevice(device_handle);
    }
    while( true ) {
      UVar1 = GetClientHandleInfo(&client_handle,&temp);
      if (UVar1 != HND_CLIENT) break;
      UpnpUnRegisterClient(client_handle);
    }
    TimerThreadShutdown(&gTimerThread);
    iVar2 = 0;
    StopMiniServer();
    web_server_destroy();
    ThreadPoolShutdown(&gMiniServerThreadPool);
    PrintThreadPoolStats
              (&gMiniServerThreadPool,".upnp/src/api/upnpapi.c",0x2da,"MiniServer Thread Pool");
    ThreadPoolShutdown(&gRecvThreadPool);
    PrintThreadPoolStats(&gSendThreadPool,".upnp/src/api/upnpapi.c",0x2de,"Send Thread Pool");
    ThreadPoolShutdown(&gSendThreadPool);
    PrintThreadPoolStats(&gRecvThreadPool,".upnp/src/api/upnpapi.c",0x2e1,"Recv Thread Pool");
    pthread_mutex_destroy((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    pthread_rwlock_destroy((pthread_rwlock_t *)&GlobalHndRWLock);
    pthread_mutex_destroy((pthread_mutex_t *)&gUUIDMutex);
    UpnpRemoveAllVirtualDirs();
    UpnpSdkInit = 0;
    UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x2ed,
               "Exiting UpnpFinish: UpnpSdkInit is :%d:\n",0);
    UpnpCloseLog();
  }
  else {
    iVar2 = -0x74;
  }
  return iVar2;
}

Assistant:

int UpnpFinish(void)
{
#ifdef INCLUDE_DEVICE_APIS
	UpnpDevice_Handle device_handle;
#endif
#ifdef INCLUDE_CLIENT_APIS
	UpnpClient_Handle client_handle;
#endif
	struct Handle_Info *temp;
#ifdef UPNP_ENABLE_OPEN_SSL
	if (gSslCtx) {
		SSL_CTX_free(gSslCtx);
		gSslCtx = NULL;
	}
#endif
	if (UpnpSdkInit != 1)
		return UPNP_E_FINISH;
	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpFinish: UpnpSdkInit is %d\n",
		UpnpSdkInit);
	if (UpnpSdkInit == 1)
		UpnpPrintf(UPNP_INFO,
			API,
			__FILE__,
			__LINE__,
			"UpnpFinish: UpnpSdkInit is ONE\n");
	PrintThreadPoolStats(
		&gSendThreadPool, __FILE__, __LINE__, "Send Thread Pool");
	PrintThreadPoolStats(
		&gRecvThreadPool, __FILE__, __LINE__, "Recv Thread Pool");
	PrintThreadPoolStats(&gMiniServerThreadPool,
		__FILE__,
		__LINE__,
		"MiniServer Thread Pool");
#ifdef INCLUDE_DEVICE_APIS
	while (GetDeviceHandleInfo(0, AF_INET, &device_handle, &temp) ==
		HND_DEVICE) {
		UpnpUnRegisterRootDevice(device_handle);
	}
	while (GetDeviceHandleInfo(0, AF_INET6, &device_handle, &temp) ==
		HND_DEVICE) {
		UpnpUnRegisterRootDevice(device_handle);
	}
#endif
#ifdef INCLUDE_CLIENT_APIS
	while (HND_CLIENT == GetClientHandleInfo(&client_handle, &temp)) {
		UpnpUnRegisterClient(client_handle);
	}
#endif
	TimerThreadShutdown(&gTimerThread);
#if EXCLUDE_MINISERVER == 0
	StopMiniServer();
#endif
#if EXCLUDE_WEB_SERVER == 0
	web_server_destroy();
#endif
	ThreadPoolShutdown(&gMiniServerThreadPool);
	PrintThreadPoolStats(&gMiniServerThreadPool,
		__FILE__,
		__LINE__,
		"MiniServer Thread Pool");
	ThreadPoolShutdown(&gRecvThreadPool);
	PrintThreadPoolStats(
		&gSendThreadPool, __FILE__, __LINE__, "Send Thread Pool");
	ThreadPoolShutdown(&gSendThreadPool);
	PrintThreadPoolStats(
		&gRecvThreadPool, __FILE__, __LINE__, "Recv Thread Pool");
#ifdef INCLUDE_CLIENT_APIS
	ithread_mutex_destroy(&GlobalClientSubscribeMutex);
#endif
	ithread_rwlock_destroy(&GlobalHndRWLock);
	ithread_mutex_destroy(&gUUIDMutex);
	/* remove all virtual dirs */
	UpnpRemoveAllVirtualDirs();
	UpnpSdkInit = 0;
	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"Exiting UpnpFinish: UpnpSdkInit is :%d:\n",
		UpnpSdkInit);
	UpnpCloseLog();
	/* Clean-up ithread library resources */
	ithread_cleanup_library();

	return UPNP_E_SUCCESS;
}